

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall deqp::egl::GLES2ThreadTest::MakeCurrent::exec(MakeCurrent *this,Thread *t)

{
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *other;
  _func_int **pp_Var1;
  EGLSurface pvVar2;
  deUint32 dVar3;
  Thread *pTVar4;
  MessageBuilder *pMVar5;
  undefined1 local_1b8 [400];
  
  pTVar4 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (pTVar4 != (Thread *)0x0) {
    other = &this->m_context;
    local_1b8._0_8_ = pTVar4;
    if ((this->m_context).m_ptr == (GLES2Context *)0x0) {
      de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator=
                ((SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)&pTVar4[1].m_random,other);
      std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
      std::operator<<((ostream *)(local_1b8 + 0x18),"Begin -- eglMakeCurrent(");
      pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b8,&this->m_display);
      std::operator<<((ostream *)&pMVar5->field_0x18,
                      ", EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)");
      tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(EndToken *)&tcu::ThreadUtil::Message::End)
      ;
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
      pp_Var1 = pTVar4[1].super_Thread._vptr_Thread;
      (**(code **)(*pp_Var1 + 0x138))(pp_Var1,this->m_display,0,0,0);
      dVar3 = (**(code **)(*pTVar4[1].super_Thread._vptr_Thread + 0xf8))();
      eglu::checkError(dVar3,
                       "makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                       ,0x2d1);
      local_1b8._0_8_ = pTVar4;
      std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
      std::operator<<((ostream *)(local_1b8 + 0x18),"End -- eglMakeCurrent()");
      tcu::ThreadUtil::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    }
    else {
      pTVar4[1].m_messageLock.m_mutex = (deMutex)((this->m_surface).m_ptr)->surface;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator=
                ((SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)&pTVar4[1].m_random,other);
      std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
      std::operator<<((ostream *)(local_1b8 + 0x18),"Begin -- eglMakeCurrent(");
      pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b8,&this->m_display);
      std::operator<<((ostream *)&pMVar5->field_0x18,", ");
      pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<
                         (pMVar5,&((this->m_surface).m_ptr)->surface);
      std::operator<<((ostream *)&pMVar5->field_0x18,", ");
      pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<
                         (pMVar5,&((this->m_surface).m_ptr)->surface);
      std::operator<<((ostream *)&pMVar5->field_0x18,", ");
      pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,&other->m_ptr->context);
      std::operator<<((ostream *)&pMVar5->field_0x18,")");
      tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(EndToken *)&tcu::ThreadUtil::Message::End)
      ;
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
      pp_Var1 = pTVar4[1].super_Thread._vptr_Thread;
      pvVar2 = ((this->m_surface).m_ptr)->surface;
      (**(code **)(*pp_Var1 + 0x138))
                (pp_Var1,this->m_display,pvVar2,pvVar2,((this->m_context).m_ptr)->context);
      dVar3 = (**(code **)(*pTVar4[1].super_Thread._vptr_Thread + 0xf8))();
      eglu::checkError(dVar3,
                       "makeCurrent(m_display, m_surface->surface, m_surface->surface, m_context->context)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                       ,0x2c9);
      local_1b8._0_8_ = pTVar4;
      std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
      std::operator<<((ostream *)(local_1b8 + 0x18),"End -- eglMakeCurrent()");
      tcu::ThreadUtil::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void MakeCurrent::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	if (m_context)
	{
		thread.eglSurface = m_surface->surface;
		thread.runtimeContext = m_context;

		DE_ASSERT(m_surface);
		thread.newMessage() << "Begin -- eglMakeCurrent(" << m_display << ", " << m_surface->surface << ", " << m_surface->surface << ", " << m_context->context << ")" << tcu::ThreadUtil::Message::End;
		EGLU_CHECK_CALL(thread.egl, makeCurrent(m_display, m_surface->surface, m_surface->surface, m_context->context));
		thread.newMessage() << "End -- eglMakeCurrent()" << tcu::ThreadUtil::Message::End;
	}
	else
	{
		thread.runtimeContext = m_context;

		thread.newMessage() << "Begin -- eglMakeCurrent(" << m_display << ", EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)" << tcu::ThreadUtil::Message::End;
		EGLU_CHECK_CALL(thread.egl, makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
		thread.newMessage() << "End -- eglMakeCurrent()" << tcu::ThreadUtil::Message::End;
	}
}